

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void run_the_test_code(TestSuite *suite,CgreenTest *spec,TestReporter *reporter)

{
  _Bool _Var1;
  int iVar2;
  long in_RSI;
  TestSuite *in_RDI;
  
  significant_figures_for_assert_double_are(8);
  clear_mocks();
  iVar2 = per_test_timeout_defined();
  if (iVar2 != 0) {
    validate_per_test_timeout_value();
    per_test_timeout_value();
    die_in((uint)((ulong)in_RSI >> 0x20));
  }
  _Var1 = has_setup(in_RDI);
  if (_Var1) {
    (*in_RDI->setup)();
  }
  else if (*(long *)(*(long *)(in_RSI + 8) + 0x10) != 0) {
    run_setup_for((CgreenTest *)0x10fde0);
  }
  run((CgreenTest *)0x10fdec);
  _Var1 = has_teardown(in_RDI);
  if (_Var1) {
    (*in_RDI->teardown)();
  }
  else if (*(long *)(*(long *)(in_RSI + 8) + 0x18) != 0) {
    run_teardown_for((CgreenTest *)0x10fe20);
  }
  tally_mocks((TestReporter *)0x10fe2b);
  return;
}

Assistant:

void run_the_test_code(TestSuite *suite, CgreenTest *spec, TestReporter *reporter)
{
    significant_figures_for_assert_double_are(8);
    clear_mocks();

    if (per_test_timeout_defined())
    {
        validate_per_test_timeout_value();

        die_in(per_test_timeout_value());
    }

    // for historical reasons the suite can have a setup
    if (has_setup(suite))
    {
        (*suite->setup)();
    }
    else
    {
        if (spec->context->setup != NULL)
        {
            run_setup_for(spec);
        }
    }

    run(spec);
    // for historical reasons the suite can have a teardown
    if (has_teardown(suite))
    {
        (*suite->teardown)();
    }
    else
    {
        if (spec->context->teardown != NULL)
        {
            run_teardown_for(spec);
        }
    }

    tally_mocks(reporter);
}